

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSAtom js_parse_destructuring_var(JSParseState *s,int tok,int is_arg)

{
  int iVar1;
  int in_EDX;
  JSAtom in_ESI;
  JSContext *in_RDI;
  JSAtom name;
  JSParseState *in_stack_00000038;
  JSAtom in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  JSAtom local_4;
  
  if (((*(int *)&in_RDI->rt == -0x7d) && (*(int *)&in_RDI->binary_object_count == 0)) &&
     (((*(byte *)((long)(in_RDI->array_ctor).u.ptr + 0x86) & 1) == 0 ||
      ((*(int *)&(in_RDI->link).next != 0x3a && (*(int *)&(in_RDI->link).next != 0x4d)))))) {
    local_4 = JS_DupAtom(in_RDI,in_ESI);
    if (((in_EDX != 0) &&
        (iVar1 = js_parse_check_duplicate_parameter((JSParseState *)CONCAT44(in_ESI,in_EDX),local_4)
        , iVar1 != 0)) || (iVar1 = next_token(in_stack_00000038), iVar1 != 0)) {
      JS_FreeAtom((JSContext *)CONCAT44(local_4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
                 );
      local_4 = 0;
    }
  }
  else {
    js_parse_error((JSParseState *)in_RDI,"invalid destructuring target");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static JSAtom js_parse_destructuring_var(JSParseState *s, int tok, int is_arg)
{
    JSAtom name;

    if (!(s->token.val == TOK_IDENT && !s->token.u.ident.is_reserved)
    ||  ((s->cur_func->js_mode & JS_MODE_STRICT) &&
         (s->token.u.ident.atom == JS_ATOM_eval || s->token.u.ident.atom == JS_ATOM_arguments))) {
        js_parse_error(s, "invalid destructuring target");
        return JS_ATOM_NULL;
    }
    name = JS_DupAtom(s->ctx, s->token.u.ident.atom);
    if (is_arg && js_parse_check_duplicate_parameter(s, name))
        goto fail;
    if (next_token(s))
        goto fail;

    return name;
fail:
    JS_FreeAtom(s->ctx, name);
    return JS_ATOM_NULL;
}